

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O2

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
::output_diagram(Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>
                 *this,ostream *ostream)

{
  pointer ptVar1;
  unsigned_long uVar2;
  Simplex_handle sh;
  ostream *poVar3;
  pointer ptVar4;
  double dVar5;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long,int>*,std::vector<std::tuple<unsigned_long,unsigned_long,int>,std::allocator<std::tuple<unsigned_long,unsigned_long,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>>,Gudhi::persistent_cohomology::Field_Zp>::cmp_intervals_by_length>>
            ((this->persistent_pairs_).
             super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->persistent_pairs_).
             super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::cubical_complex::Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>,_Gudhi::persistent_cohomology::Field_Zp>::cmp_intervals_by_length>
              )this->cpx_);
  ptVar1 = (this->persistent_pairs_).
           super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ptVar4 = (this->persistent_pairs_).
                super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_int>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar4 != ptVar1; ptVar4 = ptVar4 + 1) {
    uVar2 = (ptVar4->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
            super__Tuple_impl<1UL,_unsigned_long,_int>.super__Head_base<1UL,_unsigned_long,_false>.
            _M_head_impl;
    sh = (ptVar4->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
         super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    poVar3 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)ostream,
                        (ptVar4->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
                        super__Tuple_impl<1UL,_unsigned_long,_int>.super__Tuple_impl<2UL,_int>.
                        super__Head_base<2UL,_int,_false>._M_head_impl);
    poVar3 = std::operator<<(poVar3,"  ");
    cubical_complex::
    Bitmap_cubical_complex<Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>_>::dimension
              (this->cpx_,sh);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," ");
    dVar5 = INFINITY;
    if (sh != 0xffffffffffffffff) {
      dVar5 = (this->cpx_->super_Bitmap_cubical_complex_base<double>).data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[sh];
    }
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    std::operator<<(poVar3," ");
    dVar5 = INFINITY;
    if (uVar2 != 0xffffffffffffffff) {
      dVar5 = (this->cpx_->super_Bitmap_cubical_complex_base<double>).data.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar2];
    }
    poVar3 = std::ostream::_M_insert<double>(dVar5);
    poVar3 = std::operator<<(poVar3," ");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void output_diagram(std::ostream& ostream = std::cout) {
    cmp_intervals_by_length cmp(cpx_);
    std::sort(std::begin(persistent_pairs_), std::end(persistent_pairs_), cmp);
    for (auto pair : persistent_pairs_) {
      ostream << get<2>(pair) << "  " << cpx_->dimension(get<0>(pair)) << " "
        << cpx_->filtration(get<0>(pair)) << " "
        << cpx_->filtration(get<1>(pair)) << " " << std::endl;
    }
  }